

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcMan.c
# Opt level: O1

Mvc_Manager_t * Mvc_ManagerStart(void)

{
  Mvc_Manager_t *pMVar1;
  Extra_MmFixed_t *pEVar2;
  
  pMVar1 = (Mvc_Manager_t *)malloc(0x20);
  pMVar1->pManC = (Extra_MmFixed_t *)0x0;
  pMVar1->pMan1 = (Extra_MmFixed_t *)0x0;
  pMVar1->pMan2 = (Extra_MmFixed_t *)0x0;
  pMVar1->pMan4 = (Extra_MmFixed_t *)0x0;
  pEVar2 = Extra_MmFixedStart(0x18);
  pMVar1->pMan1 = pEVar2;
  pEVar2 = Extra_MmFixedStart(0x1c);
  pMVar1->pMan2 = pEVar2;
  pEVar2 = Extra_MmFixedStart(0x24);
  pMVar1->pMan4 = pEVar2;
  pEVar2 = Extra_MmFixedStart(0x50);
  pMVar1->pManC = pEVar2;
  return pMVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mvc_Manager_t * Mvc_ManagerStart()
{
    Mvc_Manager_t * p;
    p = ABC_ALLOC( Mvc_Manager_t, 1 );
    memset( p, 0, sizeof(Mvc_Manager_t) );
    p->pMan1 = Extra_MmFixedStart( sizeof(Mvc_Cube_t)                              );
    p->pMan2 = Extra_MmFixedStart( sizeof(Mvc_Cube_t) +     sizeof(Mvc_CubeWord_t) );
    p->pMan4 = Extra_MmFixedStart( sizeof(Mvc_Cube_t) + 3 * sizeof(Mvc_CubeWord_t) );
    p->pManC = Extra_MmFixedStart( sizeof(Mvc_Cover_t) );
    return p;
}